

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::GroupNode>
embree::SceneGraph::flatten(Ref<embree::SceneGraph::GroupNode> *node,InstancingMode mode)

{
  long *in_RSI;
  GroupNode *in_RDI;
  _func_int **local_c0;
  long *local_88;
  long *local_80 [4];
  long **local_60;
  long **local_50;
  undefined8 in_stack_ffffffffffffffc0;
  Ref<embree::SceneGraph::Node> *in_stack_ffffffffffffffc8;
  
  local_88 = (long *)*in_RSI;
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 0x10))();
  }
  flatten(in_stack_ffffffffffffffc8,(InstancingMode)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (local_80[0] == (long *)0x0) {
    local_c0 = (_func_int **)0x0;
  }
  else {
    local_c0 = (_func_int **)__dynamic_cast(local_80[0],&Node::typeinfo,&GroupNode::typeinfo,0);
  }
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = local_c0;
  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
  }
  local_60 = local_80;
  if (local_80[0] != (long *)0x0) {
    (**(code **)(*local_80[0] + 0x18))();
  }
  local_50 = &local_88;
  if (local_88 != (long *)0x0) {
    (**(code **)(*local_88 + 0x18))();
  }
  return (Ref<embree::SceneGraph::GroupNode>)in_RDI;
}

Assistant:

Ref<SceneGraph::GroupNode> SceneGraph::flatten(Ref<SceneGraph::GroupNode> node, SceneGraph::InstancingMode mode) {
    return flatten(node.dynamicCast<SceneGraph::Node>(),mode).dynamicCast<SceneGraph::GroupNode>();
  }